

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O0

void __thiscall APITests::test_setup_multiple_outputs1(APITests *this)

{
  long in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa0;
  undefined4 local_50;
  undefined4 local_4c;
  allocator_type *__a;
  vector<int,_std::allocator<int>_> *this_00;
  initializer_list<int> in_stack_ffffffffffffffc8;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 *local_18;
  undefined8 local_10;
  
  GPIO::setmode(BOARD);
  local_20 = *(undefined4 *)(in_RDI + 0x20);
  local_1c = *(undefined4 *)(in_RDI + 0x28);
  local_18 = &local_20;
  local_10 = 2;
  local_50 = 1;
  local_4c = 0;
  __a = (allocator_type *)&local_50;
  this_00 = (vector<int,_std::allocator<int>_> *)0x2;
  std::allocator<int>::allocator((allocator<int> *)0x13dc50);
  std::vector<int,_std::allocator<int>_>::vector(this_00,in_stack_ffffffffffffffc8,__a);
  GPIO::setup((initializer_list *)&local_18,OUT,(vector *)&stack0xffffffffffffffc8);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffffa0);
  std::allocator<int>::~allocator((allocator<int> *)0x13dc95);
  GPIO::cleanup();
  return;
}

Assistant:

void test_setup_multiple_outputs1()
    {
        GPIO::setmode(GPIO::BOARD);
        GPIO::setup({pin_data.out_a, pin_data.out_b}, GPIO::OUT, {GPIO::HIGH, GPIO::LOW});
        GPIO::cleanup();
    }